

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_exceptions.cpp
# Opt level: O0

void nested_subflow(uint N)

{
  code *pcVar1;
  byte extraout_AL;
  byte extraout_AL_00;
  byte extraout_AL_01;
  byte extraout_AL_02;
  byte extraout_AL_03;
  byte extraout_AL_04;
  ContextOptions *pCVar2;
  unsigned_long *puVar3;
  Enum EVar4;
  Enum EVar5;
  Enum EVar6;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  Expression_lhs<const_unsigned_long_&> EVar7;
  ResultBuilder DOCTEST_RB_5;
  ResultBuilder DOCTEST_RB_4;
  ResultBuilder DOCTEST_RB_3;
  ResultBuilder DOCTEST_RB_2;
  ResultBuilder DOCTEST_RB_1;
  type *anon_var_0;
  ResultBuilder DOCTEST_RB;
  size_t num_tasks;
  Taskflow taskflow;
  Executor executor;
  string *in_stack_fffffffffffff848;
  Result *pRVar8;
  undefined4 in_stack_fffffffffffff850;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffff854;
  Executor *in_stack_fffffffffffff858;
  int line;
  undefined4 in_stack_fffffffffffff860;
  undefined4 uVar10;
  undefined4 in_stack_fffffffffffff864;
  Executor *in_stack_fffffffffffff868;
  Enum at;
  undefined4 in_stack_fffffffffffff870;
  undefined4 in_stack_fffffffffffff874;
  undefined4 in_stack_fffffffffffff880;
  undefined4 uVar11;
  undefined4 in_stack_fffffffffffff884;
  char *in_stack_fffffffffffff888;
  undefined4 in_stack_fffffffffffff890;
  undefined4 in_stack_fffffffffffff894;
  FlowBuilder *in_stack_fffffffffffff898;
  undefined4 in_stack_fffffffffffff8d0;
  undefined4 in_stack_fffffffffffff8d4;
  Expression_lhs<const_unsigned_long_&> *in_stack_fffffffffffff8d8;
  shared_ptr<tf::WorkerInterface> *in_stack_fffffffffffff938;
  undefined8 in_stack_fffffffffffff940;
  undefined8 in_stack_fffffffffffff948;
  ExpressionDecomposer local_654;
  unsigned_long *local_650;
  Enum local_648;
  ResultBuilder local_620;
  undefined1 *local_5a8;
  undefined4 local_58c;
  unsigned_long *local_588;
  Enum local_580;
  ExpressionDecomposer local_574;
  unsigned_long *local_570;
  Enum local_568;
  ResultBuilder local_540;
  undefined1 *local_4c8;
  undefined1 *local_4c0;
  undefined4 local_4b4;
  unsigned_long *local_4b0;
  Enum local_4a8;
  ExpressionDecomposer local_49c;
  unsigned_long *local_498;
  Enum local_490;
  ResultBuilder local_468;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  undefined4 local_3cc;
  unsigned_long *local_3c8;
  Enum local_3c0;
  ExpressionDecomposer local_3b4;
  unsigned_long *local_3b0;
  Enum local_3a8;
  ResultBuilder local_380;
  ResultBuilder local_2e0;
  allocator<char> local_261;
  string local_260 [32];
  undefined8 *local_240;
  undefined8 local_230;
  undefined1 local_228 [232];
  undefined1 local_140 [320];
  
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)
             CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),in_stack_fffffffffffff848
            );
  tf::Executor::Executor
            ((Executor *)in_stack_fffffffffffff948,in_stack_fffffffffffff940,
             in_stack_fffffffffffff938);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x11eb56);
  tf::Taskflow::Taskflow((Taskflow *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870));
  local_230 = 0;
  local_240 = &local_230;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_exceptions_cpp:441:20),_nullptr>
            (in_stack_fffffffffffff898,
             (anon_class_8_1_739dd435 *)
             CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),in_stack_fffffffffffff888
             ,(allocator<char> *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880));
  tf::Task::name((Task *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                 in_stack_fffffffffffff848);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator(&local_261);
  pCVar2 = doctest::getContextOptions();
  if ((pCVar2->no_throw & 1U) == 0) {
    doctest::detail::ResultBuilder::ResultBuilder
              ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
               (Enum)((ulong)in_stack_fffffffffffff868 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
               (int)((ulong)in_stack_fffffffffffff858 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),"x",
               (char *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880));
    tf::Executor::run_n(in_stack_fffffffffffff868,
                        (Taskflow *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
                        (size_t)in_stack_fffffffffffff858);
    std::future<void>::get
              ((future<void> *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    tf::Future<void>::~Future
              ((Future<void> *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
    doctest::detail::ResultBuilder::log(&local_2e0,__x);
    if ((extraout_AL & 1) != 0) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    doctest::detail::ResultBuilder::react
              ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x11ee5b);
  }
  pRVar8 = (Result *)0x1d263f;
  EVar6 = (Enum)((ulong)in_stack_fffffffffffff868 >> 0x20);
  doctest::detail::ResultBuilder::ResultBuilder
            ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),EVar6,
             (char *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
             (int)((ulong)in_stack_fffffffffffff858 >> 0x20),
             (char *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),"",
             (char *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880));
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_3b4,DT_REQUIRE);
  EVar7 = doctest::detail::ExpressionDecomposer::operator<<<unsigned_long,_nullptr>
                    ((ExpressionDecomposer *)
                     CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                     (unsigned_long *)pRVar8);
  local_3c8 = EVar7.lhs;
  local_3c0 = EVar7.m_at;
  local_3cc = 0xc;
  local_3b0 = local_3c8;
  local_3a8 = local_3c0;
  doctest::detail::Expression_lhs<unsigned_long_const&>::operator==
            (in_stack_fffffffffffff8d8,
             (int *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
  doctest::detail::ResultBuilder::setResult
            ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),pRVar8);
  doctest::detail::Result::~Result((Result *)0x11ef61);
  doctest::detail::ResultBuilder::log(&local_380,__x_00);
  if ((extraout_AL_00 & 1) != 0) {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react
            ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
  doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x11f034);
  local_230 = 0;
  local_3f0 = local_140;
  local_3e8 = local_228;
  tf::Executor::async<nested_subflow(unsigned_int)::__1>
            (in_stack_fffffffffffff858,
             (anon_class_16_2_465f4659_for__M_fn *)
             CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
  std::future<void>::get
            ((future<void> *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
  std::future<void>::~future((future<void> *)0x11f095);
  pRVar8 = (Result *)0x1d263f;
  doctest::detail::ResultBuilder::ResultBuilder
            ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),EVar6,
             (char *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
             (int)((ulong)in_stack_fffffffffffff858 >> 0x20),
             (char *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),"",
             (char *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880));
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_49c,DT_REQUIRE);
  EVar7 = doctest::detail::ExpressionDecomposer::operator<<<unsigned_long,_nullptr>
                    ((ExpressionDecomposer *)
                     CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                     (unsigned_long *)pRVar8);
  local_4b0 = EVar7.lhs;
  EVar4 = EVar7.m_at;
  local_4b4 = 0xc;
  local_4a8 = EVar4;
  local_498 = local_4b0;
  local_490 = EVar4;
  doctest::detail::Expression_lhs<unsigned_long_const&>::operator==
            (in_stack_fffffffffffff8d8,
             (int *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
  doctest::detail::ResultBuilder::setResult
            ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),pRVar8);
  doctest::detail::Result::~Result((Result *)0x11f181);
  doctest::detail::ResultBuilder::log(&local_468,__x_01);
  uVar11 = CONCAT13(extraout_AL_01,(int3)in_stack_fffffffffffff880);
  if ((extraout_AL_01 & 1) != 0) {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react
            ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
  doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x11f28f);
  local_230 = 0;
  local_4c8 = local_140;
  local_4c0 = local_228;
  tf::Executor::silent_async<nested_subflow(unsigned_int)::__3>
            ((Executor *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
             (anon_class_16_2_465f4659 *)pRVar8);
  tf::Executor::wait_for_all((Executor *)CONCAT44(EVar4,uVar11));
  pRVar8 = (Result *)0x1d263f;
  doctest::detail::ResultBuilder::ResultBuilder
            ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),EVar6,
             (char *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
             (int)((ulong)in_stack_fffffffffffff858 >> 0x20),
             (char *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),"",
             (char *)CONCAT44(EVar4,uVar11));
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_574,DT_REQUIRE);
  EVar7 = doctest::detail::ExpressionDecomposer::operator<<<unsigned_long,_nullptr>
                    ((ExpressionDecomposer *)
                     CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                     (unsigned_long *)pRVar8);
  local_588 = EVar7.lhs;
  EVar5 = EVar7.m_at;
  local_58c = 0xc;
  local_580 = EVar5;
  local_570 = local_588;
  local_568 = EVar5;
  doctest::detail::Expression_lhs<unsigned_long_const&>::operator==
            (in_stack_fffffffffffff8d8,
             (int *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
  doctest::detail::ResultBuilder::setResult
            ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),pRVar8);
  doctest::detail::Result::~Result((Result *)0x11f3c9);
  doctest::detail::ResultBuilder::log(&local_540,__x_02);
  uVar9 = CONCAT13(extraout_AL_02,(int3)in_stack_fffffffffffff870);
  if ((extraout_AL_02 & 1) == 0) {
    doctest::detail::ResultBuilder::react
              ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x11f4ae);
    local_230 = 0;
    local_5a8 = local_228;
    tf::Executor::async<nested_subflow(unsigned_int)::__2>
              (in_stack_fffffffffffff858,
               (anon_class_8_1_cf8211b1_for_f *)
               CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
    line = (int)((ulong)in_stack_fffffffffffff858 >> 0x20);
    std::future<void>::get
              ((future<void> *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    std::future<void>::~future((future<void> *)0x11f507);
    pRVar8 = (Result *)0x1d263f;
    doctest::detail::ResultBuilder::ResultBuilder
              ((ResultBuilder *)CONCAT44(EVar5,uVar9),EVar6,
               (char *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),line,
               (char *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),"",
               (char *)CONCAT44(EVar4,uVar11));
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_654,DT_REQUIRE);
    EVar7 = doctest::detail::ExpressionDecomposer::operator<<<unsigned_long,_nullptr>
                      ((ExpressionDecomposer *)
                       CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                       (unsigned_long *)pRVar8);
    puVar3 = EVar7.lhs;
    EVar6 = EVar7.m_at;
    local_650 = puVar3;
    local_648 = EVar6;
    doctest::detail::Expression_lhs<unsigned_long_const&>::operator==
              (in_stack_fffffffffffff8d8,
               (int *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
    at = (Enum)((ulong)puVar3 >> 0x20);
    doctest::detail::ResultBuilder::setResult
              ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),pRVar8
              );
    doctest::detail::Result::~Result((Result *)0x11f5f3);
    doctest::detail::ResultBuilder::log(&local_620,__x_03);
    uVar10 = CONCAT13(extraout_AL_03,(int3)in_stack_fffffffffffff860);
    if ((extraout_AL_03 & 1) != 0) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    doctest::detail::ResultBuilder::react
              ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x11f701);
    local_230 = 0;
    tf::Executor::silent_async<nested_subflow(unsigned_int)::__4>
              ((Executor *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
               (anon_class_8_1_cf8211b1 *)pRVar8);
    tf::Executor::wait_for_all((Executor *)CONCAT44(EVar4,uVar11));
    pRVar8 = (Result *)0x1d263f;
    doctest::detail::ResultBuilder::ResultBuilder
              ((ResultBuilder *)CONCAT44(EVar5,uVar9),at,(char *)CONCAT44(EVar6,uVar10),line,
               (char *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),"",
               (char *)CONCAT44(EVar4,uVar11));
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer
              ((ExpressionDecomposer *)&stack0xfffffffffffff8dc,DT_REQUIRE);
    EVar7 = doctest::detail::ExpressionDecomposer::operator<<<unsigned_long,_nullptr>
                      ((ExpressionDecomposer *)
                       CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                       (unsigned_long *)pRVar8);
    EVar6 = EVar7.m_at;
    doctest::detail::Expression_lhs<unsigned_long_const&>::operator==
              (in_stack_fffffffffffff8d8,(int *)CONCAT44(in_stack_fffffffffffff8d4,EVar6));
    doctest::detail::ResultBuilder::setResult
              ((ResultBuilder *)CONCAT44(EVar6,in_stack_fffffffffffff850),pRVar8);
    doctest::detail::Result::~Result((Result *)0x11f82d);
    doctest::detail::ResultBuilder::log((ResultBuilder *)&stack0xfffffffffffff910,__x_04);
    uVar9 = CONCAT13(extraout_AL_04,(int3)in_stack_fffffffffffff850);
    if ((extraout_AL_04 & 1) == 0) {
      doctest::detail::ResultBuilder::react((ResultBuilder *)CONCAT44(EVar6,uVar9));
      doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x11f90c);
      tf::Taskflow::~Taskflow((Taskflow *)CONCAT44(EVar6,uVar9));
      tf::Executor::~Executor((Executor *)CONCAT44(EVar4,uVar11));
      return;
    }
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  pcVar1 = (code *)swi(3);
  (*pcVar1)();
  return;
}

Assistant:

void nested_subflow(unsigned N) {

  tf::Executor executor(N);
  tf::Taskflow taskflow;

  size_t num_tasks = 0;

  // level 1
  taskflow.emplace([&](tf::Subflow& sf1) {
    tf::Task V1 = sf1.emplace([&num_tasks](){ ++num_tasks; }).name("V1");
    tf::Task W1 = sf1.emplace([&num_tasks](){ ++num_tasks; }).name("W1");
    
    // level 2
    tf::Task X1 = sf1.emplace([&num_tasks](tf::Subflow& sf2){ 
      ++num_tasks; 

      tf::Task V2 = sf2.emplace([&num_tasks](){ ++num_tasks; }).name("V2");
      tf::Task W2 = sf2.emplace([&num_tasks](){ ++num_tasks; }).name("W2");
      
      // level 3
      tf::Task X2 = sf2.emplace([&num_tasks](tf::Subflow& sf3) {
        ++num_tasks;

        tf::Task V3 = sf3.emplace([&num_tasks](){ ++num_tasks; }).name("V3");
        tf::Task W3 = sf3.emplace([&num_tasks](){ ++num_tasks; }).name("W3");

        // level 4
        tf::Task X3 = sf3.emplace([&num_tasks](tf::Subflow& sf4){
          ++num_tasks;

          tf::Task V4 = sf4.emplace([&num_tasks](){ ++num_tasks; }).name("V4");
          tf::Task W4 = sf4.emplace([&num_tasks](){ ++num_tasks; }).name("W4");
          tf::Task X4 = sf4.emplace([&num_tasks](){ 
            ++num_tasks; 
            throw std::runtime_error("x");
          }).name("X4 (throw)");
          tf::Task Y4 = sf4.emplace([&num_tasks](){ ++num_tasks; }).name("Y4");
          tf::Task Z4 = sf4.emplace([&num_tasks](){ ++num_tasks; }).name("Z4");

          V4.precede(W4);
          W4.precede(X4);
          X4.precede(Y4);
          Y4.precede(Z4);
        }).name("sf-4");

        tf::Task Y3 = sf3.emplace([&num_tasks](){ ++num_tasks; }).name("Y3");
        tf::Task Z3 = sf3.emplace([&num_tasks](){ ++num_tasks; }).name("Z3");

        V3.precede(W3);
        W3.precede(X3);
        X3.precede(Y3);
        Y3.precede(Z3);
      }).name("sf3");

      tf::Task Y2 = sf2.emplace([&num_tasks](){ ++num_tasks; }).name("Y2");
      tf::Task Z2 = sf2.emplace([&num_tasks](){ ++num_tasks; }).name("Z2");

      V2.precede(W2);
      W2.precede(X2);
      X2.precede(Y2);
      Y2.precede(Z2);
    }).name("sf-2");

    tf::Task Y1 = sf1.emplace([&num_tasks](){ ++num_tasks; }).name("Y1");
    tf::Task Z1 = sf1.emplace([&num_tasks](){ ++num_tasks; }).name("Z1");

    V1.precede(W1);
    W1.precede(X1);
    X1.precede(Y1);
    Y1.precede(Z1);
  }).name("sf-1");

  REQUIRE_THROWS_WITH_AS(executor.run_n(taskflow, 10).get(), "x", std::runtime_error);
  REQUIRE(num_tasks == 12);
  
  //taskflow.dump(std::cout);

  // corun the nested subflow from an async task
  num_tasks = 0;
  executor.async([&](){
    REQUIRE_THROWS_WITH_AS(executor.corun(taskflow), "x", std::runtime_error);
  }).get(); 
  REQUIRE(num_tasks == 12);
  
  // corun the nested subflow from an silent async task
  num_tasks = 0;
  executor.silent_async([&](){
    REQUIRE_THROWS_WITH_AS(executor.corun(taskflow), "x", std::runtime_error);
  });
  executor.wait_for_all(); 
  REQUIRE(num_tasks == 12);
  
  // corun the nested subflow from an async task's runtime
  num_tasks = 0;
  executor.async([&](tf::Runtime& rt){
    REQUIRE_THROWS_WITH_AS(rt.corun(taskflow), "x", std::runtime_error);
  }).get(); 
  REQUIRE(num_tasks == 12);
  
  // corun the nested subflow from an silent-async task's runtime
  num_tasks = 0;
  executor.silent_async([&](tf::Runtime& rt){
    REQUIRE_THROWS_WITH_AS(rt.corun(taskflow), "x", std::runtime_error);
  });
  executor.wait_for_all(); 
  REQUIRE(num_tasks == 12);

}